

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::string_t,duckdb::string_t,bool,duckdb::BinarySingleArgumentOperatorWrapper,duckdb::Equals,bool,true,false>
               (string_t *ldata,string_t *rdata,bool *result_data,idx_t count,ValidityMask *mask,
               bool fun)

{
  anon_struct_16_3_d7536bce_for_pointer *paVar1;
  unsigned_long *puVar2;
  ulong uVar3;
  char *pcVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  bool bVar9;
  ulong uVar10;
  char **ppcVar11;
  ulong uVar12;
  idx_t iVar13;
  ulong uVar14;
  char **local_70;
  
  puVar2 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  if (puVar2 == (unsigned_long *)0x0) {
    if (count != 0) {
      uVar8 = *(ulong *)&ldata->value;
      pcVar4 = (ldata->value).pointer.ptr;
      local_70 = &(rdata->value).pointer.ptr;
      iVar13 = 0;
      do {
        paVar1 = (anon_struct_16_3_d7536bce_for_pointer *)(local_70 + -1);
        uVar10._0_4_ = paVar1->length;
        uVar10._4_1_ = paVar1->prefix[0];
        uVar10._5_1_ = paVar1->prefix[1];
        uVar10._6_1_ = paVar1->prefix[2];
        uVar10._7_1_ = paVar1->prefix[3];
        if (uVar8 == uVar10) {
          bVar9 = true;
          if ((pcVar4 != *local_70) &&
             (((uint)uVar8 < 0xd || (iVar6 = bcmp(pcVar4,*local_70,uVar8 & 0xffffffff), iVar6 != 0))
             )) goto LAB_01389d76;
        }
        else {
LAB_01389d76:
          bVar9 = false;
        }
        result_data[iVar13] = bVar9;
        iVar13 = iVar13 + 1;
        local_70 = local_70 + 2;
      } while (count != iVar13);
    }
  }
  else if (0x3f < count + 0x3f) {
    uVar10 = 0;
    uVar8 = 0;
    do {
      uVar3 = puVar2[uVar10];
      uVar14 = uVar8 + 0x40;
      if (count <= uVar8 + 0x40) {
        uVar14 = count;
      }
      uVar7 = uVar14;
      if (uVar3 != 0) {
        uVar7 = uVar8;
        if (uVar3 == 0xffffffffffffffff) {
          if (uVar8 < uVar14) {
            uVar3 = *(ulong *)&ldata->value;
            pcVar4 = (ldata->value).pointer.ptr;
            ppcVar11 = &rdata[uVar8].value.pointer.ptr;
            do {
              paVar1 = (anon_struct_16_3_d7536bce_for_pointer *)(ppcVar11 + -1);
              uVar8._0_4_ = paVar1->length;
              uVar8._4_1_ = paVar1->prefix[0];
              uVar8._5_1_ = paVar1->prefix[1];
              uVar8._6_1_ = paVar1->prefix[2];
              uVar8._7_1_ = paVar1->prefix[3];
              if (uVar3 == uVar8) {
                bVar9 = true;
                if ((pcVar4 != *ppcVar11) &&
                   (((uint)uVar3 < 0xd ||
                    (iVar6 = bcmp(pcVar4,*ppcVar11,uVar3 & 0xffffffff), iVar6 != 0))))
                goto LAB_01389c94;
              }
              else {
LAB_01389c94:
                bVar9 = false;
              }
              result_data[uVar7] = bVar9;
              uVar7 = uVar7 + 1;
              ppcVar11 = ppcVar11 + 2;
            } while (uVar14 != uVar7);
          }
        }
        else if (uVar8 < uVar14) {
          ppcVar11 = &rdata[uVar8].value.pointer.ptr;
          uVar12 = 0;
          do {
            if ((uVar3 >> (uVar12 & 0x3f) & 1) != 0) {
              uVar7 = *(ulong *)&ldata->value;
              paVar1 = (anon_struct_16_3_d7536bce_for_pointer *)(ppcVar11 + -1);
              uVar5._0_4_ = paVar1->length;
              uVar5._4_1_ = paVar1->prefix[0];
              uVar5._5_1_ = paVar1->prefix[1];
              uVar5._6_1_ = paVar1->prefix[2];
              uVar5._7_1_ = paVar1->prefix[3];
              if (uVar7 == uVar5) {
                pcVar4 = (ldata->value).pointer.ptr;
                bVar9 = true;
                if ((pcVar4 != *ppcVar11) &&
                   (((uint)uVar7 < 0xd ||
                    (iVar6 = bcmp(pcVar4,*ppcVar11,uVar7 & 0xffffffff), iVar6 != 0))))
                goto LAB_01389d00;
              }
              else {
LAB_01389d00:
                bVar9 = false;
              }
              result_data[uVar8] = bVar9;
            }
            uVar8 = uVar8 + 1;
            ppcVar11 = ppcVar11 + 2;
            uVar12 = uVar12 + 1;
            uVar7 = uVar8;
          } while (uVar14 != uVar8);
        }
      }
      uVar10 = uVar10 + 1;
      uVar8 = uVar7;
    } while (uVar10 != count + 0x3f >> 6);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}